

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O3

void __thiscall
presolve::HighsPostsolveStack::doubletonEquation<HighsEmptySlice>
          (HighsPostsolveStack *this,HighsInt row,HighsInt colSubst,HighsInt col,double coefSubst,
          double coef,double rhs,double substLower,double substUpper,double substCost,
          bool lowerTightened,bool upperTightened,RowType rowType,
          HighsMatrixSlice<HighsEmptySlice> *colVec)

{
  int iVar1;
  int iVar2;
  pointer pNVar3;
  pointer pcVar4;
  pointer piVar5;
  pointer pcVar6;
  pointer pcVar7;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  int iVar8;
  size_t position;
  ReductionType local_79;
  undefined4 local_78;
  undefined4 local_74;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  unsigned_long local_38;
  
  local_74 = CONCAT31(in_register_00000089,upperTightened);
  local_78 = CONCAT31(in_register_00000081,lowerTightened);
  pNVar3 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  local_70 = &this->colValues;
  if (row == -1) {
    iVar8 = -1;
  }
  else {
    iVar8 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[row];
  }
  pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar5 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar5[colSubst];
  iVar2 = piVar5[col];
  pcVar6 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = coef;
  local_60 = coefSubst;
  local_58 = rhs;
  local_50 = substLower;
  local_48 = substUpper;
  local_40 = substCost;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar4 + (0x48 - (long)pcVar6)));
  pcVar7 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)(pcVar4 + ((long)pcVar7 - (long)pcVar6)) = local_68;
  *(double *)(pcVar4 + (long)(pcVar7 + (8 - (long)pcVar6))) = local_60;
  *(double *)(pcVar4 + (long)(pcVar7 + (0x10 - (long)pcVar6))) = local_58;
  *(double *)(pcVar4 + (long)(pcVar7 + (0x18 - (long)pcVar6))) = local_50;
  *(double *)(pcVar4 + (long)(pcVar7 + (0x20 - (long)pcVar6))) = local_48;
  *(double *)(pcVar4 + (long)(pcVar7 + (0x28 - (long)pcVar6))) = local_40;
  *(int *)(pcVar4 + (long)(pcVar7 + (0x30 - (long)pcVar6))) = iVar8;
  *(int *)(pcVar4 + (long)(pcVar7 + (0x34 - (long)pcVar6))) = iVar1;
  *(int *)(pcVar4 + (long)(pcVar7 + (0x38 - (long)pcVar6))) = iVar2;
  pcVar4[(long)(pcVar7 + (0x3c - (long)pcVar6))] = (char)local_78;
  pcVar4[(long)(pcVar7 + (0x3d - (long)pcVar6))] = (char)local_74;
  *(RowType *)(pcVar4 + (long)(pcVar7 + (0x40 - (long)pcVar6))) = rowType;
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(&this->reductionValues,local_70);
  local_79 = kDoubletonEquation;
  local_38 = (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_79,&local_38);
  return;
}

Assistant:

void doubletonEquation(HighsInt row, HighsInt colSubst, HighsInt col,
                         double coefSubst, double coef, double rhs,
                         double substLower, double substUpper, double substCost,
                         bool lowerTightened, bool upperTightened,
                         RowType rowType,
                         const HighsMatrixSlice<ColStorageFormat>& colVec) {
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(DoubletonEquation{
        coef, coefSubst, rhs, substLower, substUpper, substCost,
        row == -1 ? -1 : origRowIndex[row], origColIndex[colSubst],
        origColIndex[col], lowerTightened, upperTightened, rowType});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kDoubletonEquation);
  }